

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O1

void amrex::average_edge_to_cellcenter
               (MultiFab *cc,int dcomp,
               Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *edge,
               int ngrow)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  Box bx;
  MFIter mfi;
  int local_244;
  Box local_1ac;
  Array4<double> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)cc,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      MFIter::growntilebox(&local_1ac,&local_90,ngrow);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_190,&cc->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,
                 &(*(edge->
                    super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>)
                    .
                    super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                    ._M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                 &local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,
                 &(edge->
                  super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]->super_FabArray<amrex::FArrayBox>,
                 &local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_150,
                 &(edge->
                  super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[2]->super_FabArray<amrex::FArrayBox>,
                 &local_90);
      if (local_1ac.smallend.vect[2] <= local_1ac.bigend.vect[2]) {
        lVar4 = (long)local_1ac.smallend.vect[1];
        lVar2 = (long)local_1ac.smallend.vect[0] * 8;
        iVar1 = local_1ac.smallend.vect[2];
        local_244 = local_1ac.smallend.vect[2];
        do {
          local_244 = local_244 + 1;
          if (local_1ac.smallend.vect[1] <= local_1ac.bigend.vect[1]) {
            lVar15 = (long)iVar1;
            lVar10 = (long)local_190.begin.x;
            lVar18 = local_190.jstride * 8;
            lVar12 = (lVar4 - local_190.begin.y) * lVar18 +
                     (lVar15 - local_190.begin.z) * local_190.kstride * 8;
            lVar16 = (long)local_190.p +
                     (long)dcomp * 8 * local_190.nstride + lVar12 + lVar10 * -8 + lVar2;
            lVar6 = (long)local_190.p +
                    (long)(dcomp + 1) * 8 * local_190.nstride + lVar12 + lVar10 * -8 + lVar2;
            lVar5 = (long)local_190.p +
                    local_190.nstride * (long)(dcomp + 2) * 8 + lVar12 + lVar10 * -8 + lVar2;
            lVar19 = local_150.jstride * 8;
            lVar12 = (lVar15 - local_150.begin.z) * local_150.kstride;
            lVar10 = (long)local_150.p +
                     (lVar4 - local_150.begin.y) * lVar19 + lVar12 * 8 +
                     (long)local_150.begin.x * -8 + lVar2 + 8;
            lVar13 = (long)local_150.p +
                     ((lVar4 + 1) - (long)local_150.begin.y) * lVar19 + lVar12 * 8 +
                     (long)local_150.begin.x * -8 + lVar2 + 8;
            lVar3 = local_110.jstride * 8;
            lVar12 = (lVar4 - local_110.begin.y) * lVar3;
            lVar20 = (long)local_110.p +
                     ((long)local_244 - (long)local_110.begin.z) * local_110.kstride * 8 + lVar12 +
                     (long)local_110.begin.x * -8 + lVar2 + 8;
            lVar7 = (long)local_110.p +
                    (lVar15 - local_110.begin.z) * local_110.kstride * 8 + lVar12 +
                    (long)local_110.begin.x * -8 + lVar2 + 8;
            lVar17 = ((long)local_244 - (long)local_d0.begin.z) * local_d0.kstride * 8;
            lVar8 = (lVar15 - local_d0.begin.z) * local_d0.kstride * 8;
            lVar9 = local_d0.jstride * 8;
            lVar15 = (lVar4 - local_d0.begin.y) * lVar9;
            lVar11 = ((lVar4 + 1) - (long)local_d0.begin.y) * lVar9;
            lVar12 = (long)local_d0.begin.x;
            lVar14 = (long)local_d0.p + lVar15 + lVar17 + lVar12 * -8 + lVar2;
            lVar15 = (long)local_d0.p + lVar15 + lVar8 + lVar12 * -8 + lVar2;
            lVar17 = (long)local_d0.p + lVar17 + lVar11 + lVar12 * -8 + lVar2;
            lVar8 = (long)local_d0.p + lVar11 + lVar8 + lVar12 * -8 + lVar2;
            lVar12 = lVar4;
            do {
              if (local_1ac.smallend.vect[0] <= local_1ac.bigend.vect[0]) {
                lVar11 = 0;
                do {
                  *(double *)(lVar16 + lVar11 * 8) =
                       (*(double *)(lVar15 + lVar11 * 8) + *(double *)(lVar8 + lVar11 * 8) +
                        *(double *)(lVar14 + lVar11 * 8) + *(double *)(lVar17 + lVar11 * 8)) * 0.25;
                  *(double *)(lVar6 + lVar11 * 8) =
                       (*(double *)(lVar7 + -8 + lVar11 * 8) + *(double *)(lVar7 + lVar11 * 8) +
                        *(double *)(lVar20 + -8 + lVar11 * 8) + *(double *)(lVar20 + lVar11 * 8)) *
                       0.25;
                  *(double *)(lVar5 + lVar11 * 8) =
                       (*(double *)(lVar10 + -8 + lVar11 * 8) + *(double *)(lVar10 + lVar11 * 8) +
                        *(double *)(lVar13 + -8 + lVar11 * 8) + *(double *)(lVar13 + lVar11 * 8)) *
                       0.25;
                  lVar11 = lVar11 + 1;
                } while ((local_1ac.bigend.vect[0] - local_1ac.smallend.vect[0]) + 1 != (int)lVar11)
                ;
              }
              lVar12 = lVar12 + 1;
              lVar16 = lVar16 + lVar18;
              lVar6 = lVar6 + lVar18;
              lVar5 = lVar5 + lVar18;
              lVar10 = lVar10 + lVar19;
              lVar13 = lVar13 + lVar19;
              lVar20 = lVar20 + lVar3;
              lVar7 = lVar7 + lVar3;
              lVar14 = lVar14 + lVar9;
              lVar15 = lVar15 + lVar9;
              lVar17 = lVar17 + lVar9;
              lVar8 = lVar8 + lVar9;
            } while (local_1ac.bigend.vect[1] + 1 != (int)lVar12);
          }
          bVar21 = iVar1 != local_1ac.bigend.vect[2];
          iVar1 = iVar1 + 1;
        } while (bVar21);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void average_edge_to_cellcenter (MultiFab& cc, int dcomp,
        const Vector<const MultiFab*>& edge, int ngrow)
    {
        AMREX_ASSERT(cc.nComp() >= dcomp + AMREX_SPACEDIM);
        AMREX_ASSERT(edge.size() == AMREX_SPACEDIM);
        AMREX_ASSERT(edge[0]->nComp() == 1);
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && cc.isFusingCandidate()) {
            auto const& ccma = cc.arrays();
            AMREX_D_TERM(auto const& exma = edge[0]->const_arrays();,
                         auto const& eyma = edge[1]->const_arrays();,
                         auto const& ezma = edge[2]->const_arrays(););
            ParallelFor(cc, IntVect(ngrow),
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                amrex_avg_eg_to_cc(i, j, k, ccma[box_no],
                                   AMREX_D_DECL(exma[box_no], eyma[box_no], ezma[box_no]),
                                   dcomp);
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(cc,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box bx = mfi.growntilebox(ngrow);
                Array4<Real> const& ccarr = cc.array(mfi);
                AMREX_D_TERM(Array4<Real const> const& exarr = edge[0]->const_array(mfi);,
                             Array4<Real const> const& eyarr = edge[1]->const_array(mfi);,
                             Array4<Real const> const& ezarr = edge[2]->const_array(mfi););

                AMREX_HOST_DEVICE_PARALLEL_FOR_3D( bx, i, j, k,
                {
                    amrex_avg_eg_to_cc(i, j, k, ccarr, AMREX_D_DECL(exarr,eyarr,ezarr), dcomp);
                });
            }
        }
    }